

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::toString_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this,TypeCategory category)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(category) {
  case Bitmask:
    __s = "bitmask";
    __a = &local_9;
    break;
  case BaseType:
    __s = "basetype";
    __a = &local_a;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x41f1,"std::string VulkanHppGenerator::toString(TypeCategory)");
  case Define:
    __s = "define";
    __a = &local_b;
    break;
  case Enum:
    __s = "enum";
    __a = &local_c;
    break;
  case ExternalType:
    __s = "ExternalType";
    __a = &local_d;
    break;
  case FuncPointer:
    __s = "funcpointer";
    __a = &local_e;
    break;
  case Handle:
    __s = "handle";
    __a = &local_f;
    break;
  case Struct:
    __s = "struct";
    __a = &local_10;
    break;
  case Union:
    __s = "union";
    __a = &local_11;
    break;
  case Unknown:
    __s = "unkown";
    __a = &local_12;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::toString( TypeCategory category )
{
  switch ( category )
  {
    case TypeCategory::Bitmask     : return "bitmask";
    case TypeCategory::BaseType    : return "basetype";
    case TypeCategory::Define      : return "define";
    case TypeCategory::Enum        : return "enum";
    case TypeCategory::ExternalType: return "ExternalType";
    case TypeCategory::FuncPointer : return "funcpointer";
    case TypeCategory::Handle      : return "handle";
    case TypeCategory::Struct      : return "struct";
    case TypeCategory::Union       : return "union";
    case TypeCategory::Unknown     : return "unkown";
    default                        : assert( false ); return "";
  }
}